

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

string * __thiscall pstore::uuid::str_abi_cxx11_(string *__return_storage_ptr__,uuid *this)

{
  char cVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  lVar2 = 0;
  do {
    cVar1 = (char)__return_storage_ptr__;
    if (((uint)lVar2 < 0xb) && ((0x550U >> ((uint)lVar2 & 0x1f) & 1) != 0)) {
      std::__cxx11::string::push_back(cVar1);
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  if (__return_storage_ptr__->_M_string_length == 0x24) {
    return __return_storage_ptr__;
  }
  assert_failed("resl.length () == string_length",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                ,0xe5);
}

Assistant:

std::string uuid::str () const {
        std::string resl;
        resl.reserve (string_length);
        auto index = 0U;
        std::for_each (std::begin (data_), std::end (data_), [&] (unsigned const c) {
            if (index == 4 || index == 6 || index == 8 || index == 10) {
                resl += '-';
            }
            ++index;
            resl += digit_to_hex ((c >> 4) & 0x0F);
            resl += digit_to_hex (c & 0x0F);
        });
        PSTORE_ASSERT (resl.length () == string_length);
        return resl;
    }